

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_logger::tracker_response
          (tracker_logger *this,tracker_request *param_1,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  uint uVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  _Alloc_hider _Var6;
  pointer pcVar7;
  address *addr;
  address *extraout_RDX;
  address *extraout_RDX_00;
  address *extraout_RDX_01;
  address *extraout_RDX_02;
  address *extraout_RDX_03;
  address *extraout_RDX_04;
  address *extraout_RDX_05;
  address *extraout_RDX_06;
  address *extraout_RDX_07;
  address *extraout_RDX_08;
  address *addr_00;
  ipv6_peer_entry *p_2;
  pointer piVar8;
  ipv4_peer_entry *p_1;
  pointer piVar9;
  peer_entry *p;
  pointer ppVar10;
  span<const_char> in;
  vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *__range2;
  string local_b0;
  string local_90;
  pointer local_70;
  long local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar1 = (resp->interval).__r;
  print_address_abi_cxx11_(&local_90,(aux *)&resp->external_ip,tracker_ip);
  _Var6._M_p = local_90._M_dataplus._M_p;
  print_address_abi_cxx11_(&local_b0,(aux *)tracker_ip,addr);
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"TRACKER RESPONSE\ninterval: %d\nexternal ip: %s\nwe connected to: %s\npeers:",
             (ulong)uVar1,_Var6._M_p,local_b0._M_dataplus._M_p);
  addr_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    addr_00 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    addr_00 = extraout_RDX_01;
  }
  ppVar10 = (resp->peers).
            super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (resp->peers).
             super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar10 != local_70) {
    do {
      pcVar2 = (ppVar10->hostname)._M_dataplus._M_p;
      pcVar7 = (pointer)(ulong)ppVar10->port;
      bVar5 = digest32<160L>::is_all_zeros(&ppVar10->pid);
      if (bVar5) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"  %16s %5d %s",pcVar2,pcVar7,"");
        addr_00 = extraout_RDX_02;
      }
      else {
        in.m_len = (difference_type)_Var6._M_p;
        in.m_ptr = (char *)0x14;
        to_hex_abi_cxx11_(&local_90,(aux *)&ppVar10->pid,in);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"  %16s %5d %s",pcVar2,pcVar7,local_90._M_dataplus._M_p);
        addr_00 = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          addr_00 = extraout_RDX_04;
        }
      }
      ppVar10 = ppVar10 + 1;
      _Var6._M_p = pcVar7;
    } while (ppVar10 != local_70);
  }
  piVar9 = (resp->peers4).
           super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar3 = (resp->peers4).
           super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (piVar9 != piVar3) {
    do {
      local_68 = (ulong)*(uint *)(piVar9->ip)._M_elems << 0x20;
      local_60 = 0;
      uStack_58 = 0;
      local_50 = 0;
      print_address_abi_cxx11_(&local_b0,(aux *)&local_68,addr_00);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  %s:%d",local_b0._M_dataplus._M_p,(ulong)piVar9->port);
      addr_00 = extraout_RDX_05;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        addr_00 = extraout_RDX_06;
      }
      piVar9 = piVar9 + 1;
    } while (piVar9 != piVar3);
  }
  piVar8 = (resp->peers6).
           super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (resp->peers6).
           super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (piVar8 != piVar4) {
    do {
      local_60 = *(undefined8 *)(piVar8->ip)._M_elems;
      uStack_58 = *(undefined8 *)((piVar8->ip)._M_elems + 8);
      local_68 = 1;
      local_50 = 0;
      local_48 = local_60;
      uStack_40 = uStack_58;
      print_address_abi_cxx11_(&local_b0,(aux *)&local_68,addr_00);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  [%s]:%d",local_b0._M_dataplus._M_p,(ulong)piVar8->port);
      addr_00 = extraout_RDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        addr_00 = extraout_RDX_08;
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar4);
  }
  return;
}

Assistant:

void tracker_logger::tracker_response(tracker_request const&
			, libtorrent::address const& tracker_ip
			, std::list<address> const& tracker_ips
			, struct tracker_response const& resp)
		{
			TORRENT_UNUSED(tracker_ips);
			debug_log("TRACKER RESPONSE\n"
				"interval: %d\n"
				"external ip: %s\n"
				"we connected to: %s\n"
				"peers:"
				, resp.interval.count()
				, print_address(resp.external_ip).c_str()
				, print_address(tracker_ip).c_str());

			for (auto const& p : resp.peers)
			{
				debug_log("  %16s %5d %s", p.hostname.c_str(), p.port
					, p.pid.is_all_zeros() ? "" : to_hex(p.pid).c_str());
			}
			for (auto const& p : resp.peers4)
			{
				debug_log("  %s:%d", print_address(address_v4(p.ip)).c_str(), p.port);
			}
			for (auto const& p : resp.peers6)
			{
				debug_log("  [%s]:%d", print_address(address_v6(p.ip)).c_str(), p.port);
			}
		}